

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitContinueStatement
          (CodegenVisitor *this,ContinueStatement *continueStmt)

{
  size_type sVar1;
  long *plVar2;
  SQInteger arg2;
  SQInteger SVar3;
  SQFuncState *in_RSI;
  SQFuncState *in_RDI;
  SQIntVec *val;
  SQFuncState *in_stack_ffffffffffffffc0;
  SQFuncState *in_stack_ffffffffffffffc8;
  CodegenVisitor *in_stack_ffffffffffffffd0;
  SQFuncState *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe8;
  SQOpcode _op;
  
  _op = (SQOpcode)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  addLineNumber(in_stack_ffffffffffffffd0,(Statement *)in_stack_ffffffffffffffc8);
  sVar1 = sqvector<long,_unsigned_int>::size(&((SQFuncState *)in_RDI->_returnexp)->_continuetargets)
  ;
  if (sVar1 == 0) {
    reportDiagnostic((CodegenVisitor *)in_RDI,(Node *)in_RSI,0x26,"continue");
  }
  plVar2 = sqvector<long,_unsigned_int>::top(&((SQFuncState *)in_RDI->_returnexp)->_continuetargets)
  ;
  if (0 < *plVar2) {
    in_stack_ffffffffffffffd8 = (SQFuncState *)in_RDI->_returnexp;
    sqvector<long,_unsigned_int>::top(&((SQFuncState *)in_RDI->_returnexp)->_continuetargets);
    SQFuncState::AddInstruction
              (in_RSI,_op,(SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffd8,
               (SQInteger)in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  }
  arg2 = SQFuncState::GetStackSize((SQFuncState *)0x1c4ebd);
  plVar2 = sqvector<long,_unsigned_int>::top(&((SQFuncState *)in_RDI->_returnexp)->_blockstacksizes)
  ;
  if (arg2 != *plVar2) {
    in_stack_ffffffffffffffc8 = (SQFuncState *)in_RDI->_returnexp;
    sqvector<long,_unsigned_int>::top(&((SQFuncState *)in_RDI->_returnexp)->_blockstacksizes);
    SVar3 = SQFuncState::CountOuters(in_RDI,(SQInteger)in_stack_ffffffffffffffd8);
    if (SVar3 != 0) {
      in_stack_ffffffffffffffc0 = (SQFuncState *)in_RDI->_returnexp;
      sqvector<long,_unsigned_int>::top(&((SQFuncState *)in_RDI->_returnexp)->_blockstacksizes);
      SQFuncState::AddInstruction
                (in_RSI,_op,(SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffd8,arg2,
                 (SQInteger)in_stack_ffffffffffffffc8);
    }
  }
  SQFuncState::AddInstruction
            (in_RSI,_op,(SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffd8,arg2,
             (SQInteger)in_stack_ffffffffffffffc8);
  val = &((SQFuncState *)in_RDI->_returnexp)->_unresolvedcontinues;
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c4f94);
  sqvector<long,_unsigned_int>::push_back
            ((sqvector<long,_unsigned_int> *)in_stack_ffffffffffffffc0,(long *)val);
  return;
}

Assistant:

void CodegenVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
    addLineNumber(continueStmt);
    if (_fs->_continuetargets.size() <= 0)
        reportDiagnostic(continueStmt, DiagnosticsId::DI_LOOP_CONTROLLER_NOT_IN_LOOP, "continue");
    if (_fs->_continuetargets.top() > 0) {
        _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
    }
    RESOLVE_OUTERS();
    _fs->AddInstruction(_OP_JMP, 0, -1234);
    _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
}